

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaParseNewDoc
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlSchemaBucketPtr_conflict bucket)

{
  void *pvVar1;
  xmlSchemaValidityErrorFunc p_Var2;
  xmlSchemaValidityWarningFunc p_Var3;
  xmlSchemaValidCtxtPtr pxVar4;
  xmlStructuredErrorFunc p_Var5;
  int iVar6;
  xmlSchemaParserCtxtPtr pctxt_00;
  char *message;
  xmlSchemaParserCtxtPtr pxVar7;
  xmlChar *in_R8;
  
  if (bucket == (xmlSchemaBucketPtr_conflict)0x0) {
    return 0;
  }
  if (bucket->parsed == 0) {
    if (bucket->doc == (xmlDocPtr)0x0) {
      message = "parsing a schema doc, but there\'s no doc";
    }
    else {
      if (pctxt->constructor != (xmlSchemaConstructionCtxtPtr)0x0) {
        pctxt_00 = xmlSchemaNewParserCtxtUseDict((char *)bucket->schemaLocation,pctxt->dict);
        if (pctxt_00 == (xmlSchemaParserCtxtPtr)0x0) {
          return -1;
        }
        pctxt_00->constructor = pctxt->constructor;
        pctxt_00->schema = schema;
        pvVar1 = pctxt->errCtxt;
        p_Var2 = pctxt->error;
        p_Var3 = pctxt->warning;
        pxVar7 = pctxt_00;
        do {
          pxVar7->error = p_Var2;
          pxVar7->warning = p_Var3;
          pxVar7->errCtxt = pvVar1;
          pxVar4 = pxVar7->vctxt;
          if (pxVar4 == (xmlSchemaValidCtxtPtr)0x0) break;
          pxVar4->error = p_Var2;
          pxVar4->warning = p_Var3;
          pxVar4->errCtxt = pvVar1;
          pxVar7 = pxVar4->pctxt;
        } while (pxVar7 != (xmlSchemaParserCtxtPtr)0x0);
        pvVar1 = pctxt->errCtxt;
        p_Var5 = pctxt->serror;
        pxVar7 = pctxt_00;
        do {
          pxVar7->serror = p_Var5;
          pxVar7->errCtxt = pvVar1;
          pxVar4 = pxVar7->vctxt;
          if (pxVar4 == (xmlSchemaValidCtxtPtr)0x0) break;
          pxVar4->serror = p_Var5;
          pxVar4->error = (xmlSchemaValidityErrorFunc)0x0;
          pxVar4->warning = (xmlSchemaValidityWarningFunc)0x0;
          pxVar4->errCtxt = pvVar1;
          pxVar7 = pxVar4->pctxt;
        } while (pxVar7 != (xmlSchemaParserCtxtPtr)0x0);
        pctxt_00->counter = pctxt->counter;
        iVar6 = xmlSchemaParseNewDocWithContext(pctxt_00,schema,bucket);
        if (iVar6 != 0) {
          pctxt->err = iVar6;
        }
        pctxt->nberrors = pctxt->nberrors + pctxt_00->nberrors;
        pctxt->counter = pctxt_00->counter;
        pctxt_00->constructor = (xmlSchemaConstructionCtxtPtr)0x0;
        xmlSchemaFreeParserCtxt(pctxt_00);
        return iVar6;
      }
      message = "no constructor";
    }
  }
  else {
    message = "reparsing a schema doc";
  }
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseNewDoc",message,(xmlChar *)0x0,in_R8);
  return -1;
}

Assistant:

static int
xmlSchemaParseNewDoc(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaPtr schema,
		     xmlSchemaBucketPtr bucket)
{
    xmlSchemaParserCtxtPtr newpctxt;
    int res = 0;

    if (bucket == NULL)
	return(0);
    if (bucket->parsed) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "reparsing a schema doc");
	return(-1);
    }
    if (bucket->doc == NULL) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "parsing a schema doc, but there's no doc");
	return(-1);
    }
    if (pctxt->constructor == NULL) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "no constructor");
	return(-1);
    }
    /* Create and init the temporary parser context. */
    newpctxt = xmlSchemaNewParserCtxtUseDict(
	(const char *) bucket->schemaLocation, pctxt->dict);
    if (newpctxt == NULL)
	return(-1);
    newpctxt->constructor = pctxt->constructor;
    /*
    * TODO: Can we avoid that the parser knows about the main schema?
    * It would be better if he knows about the current schema bucket
    * only.
    */
    newpctxt->schema = schema;
    xmlSchemaSetParserErrors(newpctxt, pctxt->error, pctxt->warning,
	pctxt->errCtxt);
    xmlSchemaSetParserStructuredErrors(newpctxt, pctxt->serror,
	pctxt->errCtxt);
    newpctxt->counter = pctxt->counter;


    res = xmlSchemaParseNewDocWithContext(newpctxt, schema, bucket);

    /* Channel back errors and cleanup the temporary parser context. */
    if (res != 0)
	pctxt->err = res;
    pctxt->nberrors += newpctxt->nberrors;
    pctxt->counter = newpctxt->counter;
    newpctxt->constructor = NULL;
    /* Free the parser context. */
    xmlSchemaFreeParserCtxt(newpctxt);
    return(res);
}